

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommonTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLCommonTest_typeSizesTest_Test::~OpenDDLCommonTest_typeSizesTest_Test
          (OpenDDLCommonTest_typeSizesTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(OpenDDLCommonTest, typeSizesTest) {
    EXPECT_EQ(1U, sizeof(int8));
    EXPECT_EQ(2U, sizeof(int16));
    EXPECT_EQ(4U, sizeof(int32));
    EXPECT_EQ(8U, sizeof(int64));

    EXPECT_EQ(1U, sizeof(uint8));
    EXPECT_EQ(2U, sizeof(uint16));
    EXPECT_EQ(4U, sizeof(uint32));
    EXPECT_EQ(8U, sizeof(uint64));
}